

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window)

{
  uint uVar1;
  ImGuiPopupRef *pIVar2;
  ImGuiWindow *pIVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  if ((long)(int)uVar1 != 0) {
    uVar5 = 0;
    if (ref_window == (ImGuiWindow *)0x0) {
LAB_0011ce7d:
      if ((int)uVar5 < (int)uVar1) {
        ClosePopupToLevel((int)uVar5,false);
        return;
      }
    }
    else {
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      lVar6 = 8;
      for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
        pIVar2 = (GImGui->OpenPopupStack).Data;
        pIVar3 = pIVar2[uVar5].Window;
        if ((pIVar3 != (ImGuiWindow *)0x0) && ((pIVar3->Flags & 0x1000000) == 0)) {
          plVar7 = (long *)((long)&pIVar2->PopupId + lVar6);
          bVar9 = false;
          uVar8 = uVar5;
          while (((long)uVar8 < (long)(int)uVar1 && (!bVar9))) {
            if (*plVar7 == 0) {
              bVar9 = false;
            }
            else {
              bVar9 = *(ImGuiWindow **)(*plVar7 + 0x360) == ref_window->RootWindow;
            }
            uVar8 = uVar8 + 1;
            plVar7 = plVar7 + 6;
          }
          if (!bVar9) goto LAB_0011ce7d;
        }
        lVar6 = lVar6 + 0x30;
      }
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupRef& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack if popups are not direct descendant of the reference window (which is often the NavWindow)
            bool popup_or_descendent_has_focus = false;
            for (int m = popup_count_to_keep; m < g.OpenPopupStack.Size && !popup_or_descendent_has_focus; m++)
                if (g.OpenPopupStack[m].Window && g.OpenPopupStack[m].Window->RootWindow == ref_window->RootWindow)
                    popup_or_descendent_has_focus = true;
            if (!popup_or_descendent_has_focus)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        //IMGUI_DEBUG_LOG("ClosePopupsOverWindow(%s) -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, false);
    }
}